

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3ArrayAllocate(sqlite3 *db,void *pArray,int szEntry,int *pnEntry,int *pIdx)

{
  uint uVar1;
  int local_54;
  void *pNew;
  int sz;
  int n;
  char *z;
  int *pIdx_local;
  int *pnEntry_local;
  void *pvStack_20;
  int szEntry_local;
  void *pArray_local;
  sqlite3 *db_local;
  
  uVar1 = *pnEntry;
  pvStack_20 = pArray;
  if ((uVar1 & uVar1 - 1) == 0) {
    if (uVar1 == 0) {
      local_54 = 1;
    }
    else {
      local_54 = uVar1 << 1;
    }
    pvStack_20 = sqlite3DbRealloc(db,pArray,local_54 * szEntry);
    if (pvStack_20 == (void *)0x0) {
      *pIdx = -1;
      return pArray;
    }
  }
  memset((void *)((long)pvStack_20 + (long)(int)(uVar1 * szEntry)),0,(long)szEntry);
  *pIdx = uVar1;
  *pnEntry = *pnEntry + 1;
  return pvStack_20;
}

Assistant:

SQLITE_PRIVATE void *sqlite3ArrayAllocate(
  sqlite3 *db,      /* Connection to notify of malloc failures */
  void *pArray,     /* Array of objects.  Might be reallocated */
  int szEntry,      /* Size of each object in the array */
  int *pnEntry,     /* Number of objects currently in use */
  int *pIdx         /* Write the index of a new slot here */
){
  char *z;
  int n = *pnEntry;
  if( (n & (n-1))==0 ){
    int sz = (n==0) ? 1 : 2*n;
    void *pNew = sqlite3DbRealloc(db, pArray, sz*szEntry);
    if( pNew==0 ){
      *pIdx = -1;
      return pArray;
    }
    pArray = pNew;
  }
  z = (char*)pArray;
  memset(&z[n * szEntry], 0, szEntry);
  *pIdx = n;
  ++*pnEntry;
  return pArray;
}